

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O0

char * old_create_transform_action_spec
                 (CMFormatList format_list,CMFormatList out_format_list,char *function)

{
  int iVar1;
  FMStructDescList format_list_00;
  FMStructDescList out_format_list_00;
  char *pcVar2;
  long in_RSI;
  long in_RDI;
  bool bVar3;
  int i;
  int count;
  FMStructDescList out_structs;
  FMStructDescList structs;
  undefined4 in_stack_ffffffffffffffd0;
  int iVar4;
  int iVar5;
  undefined8 in_stack_ffffffffffffffd8;
  
  iVar5 = 0;
  while( true ) {
    bVar3 = false;
    if (in_RDI != 0) {
      bVar3 = *(long *)(in_RDI + (long)iVar5 * 0x10) != 0;
    }
    if (!bVar3) break;
    iVar5 = iVar5 + 1;
  }
  format_list_00 = (FMStructDescList)INT_CMmalloc(CONCAT44(iVar5,in_stack_ffffffffffffffd0));
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    format_list_00[iVar4].format_name = *(char **)(in_RDI + (long)iVar4 * 0x10);
    format_list_00[iVar4].field_list = *(FMFieldList *)(in_RDI + (long)iVar4 * 0x10 + 8);
    iVar1 = struct_size_field_list
                      ((FMFieldList)format_list_00,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    format_list_00[iVar4].struct_size = iVar1;
    format_list_00[iVar4].opt_info = (FMOptInfo *)0x0;
  }
  format_list_00[iVar5].format_name = (char *)0x0;
  format_list_00[iVar5].field_list = (FMFieldList)0x0;
  iVar5 = 0;
  while( true ) {
    bVar3 = false;
    if (in_RSI != 0) {
      bVar3 = *(long *)(in_RSI + (long)iVar5 * 0x10) != 0;
    }
    if (!bVar3) break;
    iVar5 = iVar5 + 1;
  }
  out_format_list_00 = (FMStructDescList)INT_CMmalloc(CONCAT44(iVar5,iVar4));
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    out_format_list_00[iVar4].format_name = *(char **)(in_RSI + (long)iVar4 * 0x10);
    out_format_list_00[iVar4].field_list = *(FMFieldList *)(in_RSI + (long)iVar4 * 0x10 + 8);
    iVar1 = struct_size_field_list
                      ((FMFieldList)format_list_00,(int)((ulong)out_format_list_00 >> 0x20));
    out_format_list_00[iVar4].struct_size = iVar1;
    out_format_list_00[iVar4].opt_info = (FMOptInfo *)0x0;
  }
  out_format_list_00[iVar5].format_name = (char *)0x0;
  out_format_list_00[iVar5].field_list = (FMFieldList)0x0;
  pcVar2 = create_transform_action_spec
                     (format_list_00,out_format_list_00,(char *)CONCAT44(iVar5,iVar4));
  return pcVar2;
}

Assistant:

extern char *
old_create_transform_action_spec(CMFormatList format_list, CMFormatList out_format_list, char *function)
{
    FMStructDescList structs, out_structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;

    count = 0;
    while (out_format_list && (out_format_list[count].format_name != NULL)) count++;
    out_structs = malloc(sizeof(out_structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	out_structs[i].format_name = out_format_list[i].format_name;
	out_structs[i].field_list = out_format_list[i].field_list;
	out_structs[i].struct_size = struct_size_field_list(out_structs[i].field_list, (int)sizeof(char*));
	out_structs[i].opt_info = NULL;
    }
    out_structs[count].format_name = NULL;
    out_structs[count].field_list = NULL;
    return create_transform_action_spec(structs, out_structs, function);
}